

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall
image_metrics::compute
          (image_metrics *this,image_u8 *a,image_u8 *b,uint32_t first_channel,uint32_t num_channels)

{
  pointer pcVar1;
  pointer pcVar2;
  uint uVar3;
  uint uVar4;
  pointer pcVar5;
  pointer pcVar6;
  uint uVar7;
  uint uVar8;
  uint32_t i;
  uint uVar9;
  long lVar10;
  uint32_t uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint32_t uVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double hist [256];
  double local_838 [257];
  
  uVar3 = a->m_width;
  uVar4 = b->m_width;
  uVar9 = uVar3;
  if (uVar4 < uVar3) {
    uVar9 = uVar4;
  }
  uVar7 = a->m_height;
  if (b->m_height < a->m_height) {
    uVar7 = b->m_height;
  }
  uVar12 = 0;
  memset(local_838,0,0x800);
  if (uVar7 != 0) {
    pcVar5 = (a->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
             .super__Vector_impl_data._M_start;
    pcVar6 = (b->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
             .super__Vector_impl_data._M_start;
    do {
      if (uVar9 != 0) {
        uVar15 = 0;
        do {
          pcVar1 = pcVar5 + (uVar12 * uVar3 + (int)uVar15);
          pcVar2 = pcVar6 + (uVar12 * uVar4 + (int)uVar15);
          uVar13 = (ulong)num_channels;
          uVar16 = first_channel;
          if (num_channels == 0) {
            uVar14 = ((uint)pcVar1->m_c[2] * 0x1279 + 0x8000 +
                      (uint)pcVar1->m_c[1] * 0xb715 + (uint)pcVar1->m_c[0] * 0x3672 >> 0x10) -
                     ((uint)pcVar2->m_c[2] * 0x1279 + 0x8000 +
                      (uint)pcVar2->m_c[1] * 0xb715 + (uint)pcVar2->m_c[0] * 0x3672 >> 0x10);
            uVar8 = -uVar14;
            if (0 < (int)uVar14) {
              uVar8 = uVar14;
            }
            local_838[uVar8] = local_838[uVar8] + 1.0;
          }
          else {
            do {
              uVar14 = (uint)pcVar1->m_c[uVar16] - (uint)pcVar2->m_c[uVar16];
              uVar8 = -uVar14;
              if (0 < (int)uVar14) {
                uVar8 = uVar14;
              }
              local_838[(ulong)uVar8 & 0xff] = local_838[(ulong)uVar8 & 0xff] + 1.0;
              uVar16 = uVar16 + 1;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar9);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar7);
  }
  this->m_max = 0.0;
  auVar19 = ZEXT816(0);
  lVar10 = 0;
  dVar20 = 0.0;
  do {
    dVar18 = local_838[lVar10];
    if ((dVar18 != 0.0) || (NAN(dVar18))) {
      dVar22 = (double)(int)lVar10;
      dVar17 = auVar19._0_8_;
      dVar23 = dVar22;
      if (dVar22 <= dVar20) {
        dVar23 = dVar20;
      }
      this->m_max = dVar23;
      auVar19._8_8_ = dVar18 * dVar22 * dVar22 + auVar19._8_8_;
      auVar19._0_8_ = dVar17 + dVar18 * dVar22;
      dVar20 = dVar23;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x100);
  uVar16 = 4;
  if (num_channels < 4) {
    uVar16 = num_channels;
  }
  uVar11 = 1;
  if (num_channels != 0) {
    uVar11 = uVar16;
  }
  auVar21._0_8_ = (double)(int)uVar11 * (double)(uVar7 * uVar9);
  auVar21._8_8_ = auVar21._0_8_;
  auVar19 = divpd(auVar19,auVar21);
  auVar21 = minpd(_DAT_001242d0,auVar19);
  dVar20 = (double)(-(ulong)(0.0 <= auVar19._8_8_) & auVar21._8_8_);
  this->m_mean = (double)(-(ulong)(0.0 <= auVar19._0_8_) & auVar21._0_8_);
  this->m_mean_squared = dVar20;
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  this->m_root_mean_squared = dVar20;
  if ((dVar20 != 0.0) || (NAN(dVar20))) {
    dVar18 = log10(255.0 / dVar20);
    dVar18 = dVar18 * 20.0;
    dVar20 = 100.0;
    if (dVar18 <= 100.0) {
      dVar20 = dVar18;
    }
    dVar20 = (double)(~-(ulong)(dVar18 < 0.0) & (ulong)dVar20);
  }
  else {
    dVar20 = 100.0;
  }
  this->m_peak_snr = dVar20;
  return;
}

Assistant:

void compute(const image_u8 &a, const image_u8 &b, uint32_t first_channel, uint32_t num_channels)
	{
		const bool average_component_error = true;

		const uint32_t width = std::min(a.width(), b.width());
		const uint32_t height = std::min(a.height(), b.height());

		assert((first_channel < 4U) && (first_channel + num_channels <= 4U));

		// Histogram approach originally due to Charles Bloom.
		double hist[256];
		memset(hist, 0, sizeof(hist));

		for (uint32_t y = 0; y < height; y++)
		{
			for (uint32_t x = 0; x < width; x++)
			{
				const color_quad_u8 &ca = a(x, y);
				const color_quad_u8 &cb = b(x, y);

				if (!num_channels)
					hist[iabs(ca.get_luma() - cb.get_luma())]++;
				else
				{
					for (uint32_t c = 0; c < num_channels; c++)
						hist[iabs(ca[first_channel + c] - cb[first_channel + c])]++;
				}
			}
		}

		m_max = 0;
		double sum = 0.0f, sum2 = 0.0f;
		for (uint32_t i = 0; i < 256; i++)
		{
			if (!hist[i])
				continue;

			m_max = std::max<double>(m_max, i);

			double x = i * hist[i];

			sum += x;
			sum2 += i * x;
		}

		// See http://richg42.blogspot.com/2016/09/how-to-compute-psnr-from-old-berkeley.html
		double total_values = width * height;

		if (average_component_error)
			total_values *= clamp<uint32_t>(num_channels, 1, 4);

		m_mean = clamp<double>(sum / total_values, 0.0f, 255.0f);
		m_mean_squared = clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);

		m_root_mean_squared = sqrt(m_mean_squared);

		if (!m_root_mean_squared)
			m_peak_snr = 100.0f;
		else
			m_peak_snr = clamp<double>(log10(255.0f / m_root_mean_squared) * 20.0f, 0.0f, 100.0f);
	}